

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

size_t qHash(QJsonArray *array,size_t seed)

{
  size_t sVar1;
  const_iterator cVar2;
  QJsonValueConstRef in_stack_00000000;
  QJsonValueConstRef in_stack_00000010;
  undefined8 local_30;
  
  QJsonArray::begin(local_30);
  cVar2 = QJsonArray::end(local_30);
  sVar1 = qHashRange<QJsonArray::const_iterator>
                    ((const_iterator)in_stack_00000010,(const_iterator)in_stack_00000000,
                     cVar2.item._8_8_);
  return sVar1;
}

Assistant:

size_t qHash(const QJsonArray &array, size_t seed)
{
    return qHashRange(array.begin(), array.end(), seed);
}